

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O3

int svd_transpose(double *A,int M,int N,double *U,double *V,double *q)

{
  int iVar1;
  
  if (M < N) {
    mtranspose(A,M,N,V);
    iVar1 = svd(V,N,M,V,U,q);
    return iVar1;
  }
  puts("M>=N. Use svd routine.");
  exit(-1);
}

Assistant:

int svd_transpose(double *A, int M, int N, double *U, double *V, double *q) {
	int ret;
	/* Call this routine if M < N
	* U = MXM
	* V - NXM
	* Q - MX1
	* A = (V * diag(Q) * U' )'
	*/

	if (M >= N) {
		printf("M>=N. Use svd routine.\n");
		exit(-1);
	}

	mtranspose(A, M, N, V);

	ret = svd(V, N, M, V, U, q);
	return ret;
}